

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

float_t __thiscall djb::microfacet::gcd(microfacet *this,vec3 *wm,vec3 *wi,vec3 *wo,args *args)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar1;
  float_t fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec3 vVar7;
  undefined8 local_38;
  float local_30;
  
  fVar2 = 0.0;
  if (((0.0 < wm->z) && (fVar2 = 0.0, 0.0 < wi->z)) && (0.0 < wo->z)) {
    vVar7 = djb::operator*(&args->minv,wi);
    local_30 = vVar7.z;
    fVar6 = vVar7.x;
    fVar1 = vVar7.y;
    fVar4 = SQRT(local_30 * local_30 + fVar6 * fVar6 + fVar1 * fVar1);
    fVar3 = 1.0 / fVar4;
    local_30 = local_30 * fVar3;
    local_38 = CONCAT44(fVar3 * fVar1,fVar3 * fVar6);
    (*(this->super_brdf)._vptr_brdf[10])(this,&local_38);
    vVar7 = djb::operator*(&args->minv,wo);
    local_30 = vVar7.z;
    fVar6 = vVar7.x;
    fVar1 = vVar7.y;
    fVar5 = SQRT(local_30 * local_30 + fVar6 * fVar6 + fVar1 * fVar1);
    fVar3 = 1.0 / fVar5;
    local_30 = local_30 * fVar3;
    local_38 = CONCAT44(fVar3 * fVar1,fVar3 * fVar6);
    (*(this->super_brdf)._vptr_brdf[10])(this,&local_38);
    fVar6 = extraout_XMM0_Da * fVar4 * wo->z;
    fVar2 = fVar6 / ((extraout_XMM0_Da_00 * fVar5 * wi->z + fVar6) - wi->z * wo->z);
  }
  return fVar2;
}

Assistant:

float_t
microfacet::gcd(
	const vec3 &wm,
	const vec3 &wi,
	const vec3 &wo,
	const args &args
) const {
	if (wm.z > 0 && wi.z > 0 && wo.z > 0) {
		float_t sigma_i = sigma(wi, args);
		float_t sigma_o = sigma(wo, args);
		float_t tmp = wo.z * sigma_i;
		return tmp / (wi.z * sigma_o + tmp - wi.z * wo.z);
	}
	return 0;
}